

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.h
# Opt level: O1

void __thiscall
agge::renderer::operator()
          (renderer *this,bitmap<unsigned_short,_0UL,_0UL> *bitmap_,vector_i offset,rect_i *window,
          mask_full<8UL> *mask,blender<unsigned_short,_unsigned_char> *blender,
          simple_alpha<unsigned_char,_8UL> *alpha)

{
  int iVar1;
  uint8_t *puVar2;
  pointer puVar3;
  uint length;
  cell *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  long lVar9;
  cell *pcVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  cell *pcVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint8_t *__s;
  int iVar19;
  long lVar20;
  uint8_t uVar21;
  uint uVar22;
  int y;
  int iVar23;
  scanline_cells sVar24;
  int local_88;
  int local_84;
  int local_74;
  int local_70;
  
  iVar19 = offset.dx;
  local_84 = bitmap_->_width + iVar19;
  iVar5 = offset.dy;
  local_70 = bitmap_->_height + iVar5;
  local_88 = iVar19;
  local_74 = iVar5;
  if (window != (rect_i *)0x0) {
    local_88 = window->x1;
    if (window->x1 <= iVar19) {
      local_88 = iVar19;
    }
    local_74 = window->y1;
    if (window->y1 <= iVar5) {
      local_74 = iVar5;
    }
    if (window->x2 <= local_84) {
      local_84 = window->x2;
    }
    if (window->y2 <= local_70) {
      local_70 = window->y2;
    }
  }
  uVar16 = (mask->super_mask<8UL>)._width;
  uVar17 = uVar16 + 4;
  if ((this->_scanline_cache)._size < uVar17) {
    puVar8 = (uint8_t *)operator_new__((ulong)uVar17);
    puVar2 = (this->_scanline_cache)._buffer;
    if (puVar2 != (uint8_t *)0x0) {
      operator_delete__(puVar2);
    }
    (this->_scanline_cache)._buffer = puVar8;
    (this->_scanline_cache)._size = uVar17;
    if (uVar16 < 0xfffffffc) {
      memset(puVar8,0,(ulong)uVar17);
    }
    else {
      *puVar8 = '\0';
      if (uVar17 == 1) {
        puVar8 = puVar8 + 1;
      }
      else {
        puVar8[1] = '\0';
        puVar8 = puVar8 + 2;
      }
      if (uVar17 != 2) {
        *puVar8 = '\0';
      }
    }
  }
  iVar1 = (mask->super_mask<8UL>)._height;
  if (0 < iVar1) {
    puVar2 = (this->_scanline_cache)._buffer;
    y = (mask->super_mask<8UL>)._min_y;
    iVar1 = iVar1 + y;
    lVar9 = (long)iVar19;
    do {
      sVar24 = tests::mocks::mask<8UL>::operator[](&mask->super_mask<8UL>,y);
      pcVar14 = sVar24.second;
      pcVar10 = sVar24.first;
      if (y < local_70 && local_74 <= y) {
        lVar15 = (ulong)bitmap_->_width * (ulong)(uint)(y - iVar5);
        puVar3 = (bitmap_->data).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pcVar10 == pcVar14) {
          iVar19 = 0;
          iVar7 = 0;
        }
        else {
          iVar19 = 0;
          iVar7 = 0;
          uVar17 = 0;
          puVar8 = puVar2;
LAB_00173124:
          iVar23 = pcVar10->x;
          iVar6 = 0;
          pcVar4 = pcVar10;
          do {
            pcVar10 = pcVar4 + 1;
            iVar6 = iVar6 + pcVar4->area;
            uVar17 = uVar17 + pcVar4->cover;
            if (pcVar10 == pcVar14) break;
            pcVar4 = pcVar10;
          } while (pcVar10->x == iVar23);
          if (iVar6 != 0) {
            iVar6 = (int)(uVar17 * 0x200 - iVar6) >> 9;
            if (0xfe < iVar6) {
              iVar6 = 0xff;
            }
            iVar12 = iVar7;
            if (iVar19 != iVar23) {
              iVar13 = iVar7;
              if (local_88 - iVar7 != 0 && iVar7 <= local_88) {
                iVar13 = local_88;
              }
              iVar11 = -(local_88 - iVar7);
              iVar12 = 0;
              if (iVar7 < local_88) {
                iVar12 = iVar11;
              }
              uVar22 = iVar12 + (iVar19 - iVar7);
              uVar16 = local_84 - iVar13;
              if ((int)uVar22 < local_84 - iVar13) {
                uVar16 = uVar22;
              }
              puVar8 = puVar2;
              iVar19 = iVar23;
              iVar12 = iVar23;
              if (0 < (int)uVar16) {
                lVar20 = -(long)iVar11;
                if (local_88 <= iVar7) {
                  lVar20 = 0;
                }
                tests::mocks::blender<unsigned_short,_unsigned_char>::operator()
                          (blender,puVar3 + lVar15 + (iVar13 - lVar9),iVar13,y,uVar16,
                           puVar2 + lVar20);
              }
            }
            iVar19 = iVar19 + 1;
            *puVar8 = (uint8_t)iVar6;
            puVar8 = puVar8 + 1;
            iVar23 = iVar23 + 1;
            iVar7 = iVar12;
          }
          if (pcVar10 != pcVar14) {
            iVar6 = pcVar10->x;
            uVar16 = iVar6 - iVar23;
            if ((uVar17 & 0x7fffff) != 0 && uVar16 != 0) {
              uVar22 = (int)(uVar17 * 0x200) >> 9;
              if (0xfe < (int)uVar22) {
                uVar22 = 0xff;
              }
              __s = puVar8;
              iVar12 = iVar7;
              if (iVar19 != iVar23) {
                iVar13 = iVar7;
                if (local_88 - iVar7 != 0 && iVar7 <= local_88) {
                  iVar13 = local_88;
                }
                iVar11 = -(local_88 - iVar7);
                iVar12 = 0;
                if (iVar7 < local_88) {
                  iVar12 = iVar11;
                }
                uVar18 = iVar12 + (iVar19 - iVar7);
                length = local_84 - iVar13;
                if ((int)uVar18 < local_84 - iVar13) {
                  length = uVar18;
                }
                __s = puVar2;
                iVar19 = iVar23;
                iVar12 = iVar23;
                if (0 < (int)length) {
                  lVar20 = -(long)iVar11;
                  if (local_88 <= iVar7) {
                    lVar20 = 0;
                  }
                  tests::mocks::blender<unsigned_short,_unsigned_char>::operator()
                            (blender,puVar3 + lVar15 + (iVar13 - lVar9),iVar13,y,length,
                             puVar2 + lVar20);
                }
              }
              iVar7 = iVar12;
              iVar19 = iVar19 + uVar16;
              puVar8 = __s + uVar16;
              uVar21 = (uint8_t)uVar22;
              if (uVar16 < 4) {
                if (iVar6 != iVar23) {
                  *__s = uVar21;
                  __s = __s + 1;
                }
                if (uVar16 != 1) {
                  *__s = uVar21;
                  __s = __s + 1;
                }
                if (uVar16 != 2) {
                  *__s = uVar21;
                }
              }
              else {
                memset(__s,uVar22 & 0xff,(ulong)uVar16);
              }
            }
            goto LAB_00173124;
          }
        }
        iVar23 = iVar7;
        if (local_88 - iVar7 != 0 && iVar7 <= local_88) {
          iVar23 = local_88;
        }
        iVar12 = -(local_88 - iVar7);
        iVar6 = 0;
        if (iVar7 < local_88) {
          iVar6 = iVar12;
        }
        uVar16 = iVar6 + (iVar19 - iVar7);
        uVar17 = local_84 - iVar23;
        if ((int)uVar16 < local_84 - iVar23) {
          uVar17 = uVar16;
        }
        if (0 < (int)uVar17) {
          lVar20 = -(long)iVar12;
          if (local_88 <= iVar7) {
            lVar20 = 0;
          }
          tests::mocks::blender<unsigned_short,_unsigned_char>::operator()
                    (blender,puVar3 + lVar15 + (iVar23 - lVar9),iVar23,y,uVar17,puVar2 + lVar20);
        }
      }
      y = y + 1;
    } while (y < iVar1);
  }
  return;
}

Assistant:

inline void renderer::operator ()(BitmapT &bitmap_, vector_i offset, const rect_i *window, const MaskT &mask, const BlenderT &blender,
		const AlphaFn &alpha)
	{
		typedef adapter<BitmapT, BlenderT> rendition_adapter;

		rendition_adapter ra(bitmap_, offset, window, blender);
		scanline_adapter<rendition_adapter> scanline(ra, _scanline_cache, mask.width());

		render(scanline, mask, alpha, 0, 1);
	}